

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<float,2>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  iVar5 = k->v1;
  iVar4 = k->v2;
  if (iVar5 != iVar4) {
    fVar1 = k->A;
    iVar8 = -iVar5;
    do {
      iVar2 = k->rowlen;
      iVar3 = k->u1;
      iVar7 = (iVar2 - iVar5) - k->w2;
      if (iVar7 < iVar3) {
        iVar7 = iVar3;
      }
      iVar6 = (iVar2 - iVar5) - k->w1;
      if (k->u2 < iVar6) {
        iVar6 = k->u2;
      }
      iVar6 = (iVar6 - iVar7) * nTxChan;
      if (0 < iVar6) {
        fVar11 = (float)iVar7 - k->u;
        fVar10 = (float)iVar5 - k->v;
        fVar12 = fVar11 * k->A * fVar11 + (k->B * fVar11 + k->C * fVar10) * fVar10;
        fVar10 = (fVar11 + fVar11 + 1.0) * k->A + fVar10 * k->B;
        iVar4 = (iVar2 + iVar8) - k->w2;
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        pfVar9 = (float *)((long)data + (long)((iVar4 + iVar2 * iVar5) * nTxChan) * 4);
        do {
          if (fVar12 < 1.0) {
            fVar11 = expf(fVar12 * -6.125);
            fVar11 = fVar11 * k->wscale;
            k->weight = k->weight + fVar11;
            *result = *pfVar9 * fVar11 + *result;
            result[1] = fVar11 * pfVar9[1] + result[1];
          }
          fVar12 = fVar12 + fVar10;
          fVar10 = fVar10 + fVar1 + fVar1;
          pfVar9 = pfVar9 + nTxChan;
        } while (pfVar9 < (float *)((long)data +
                                   (long)iVar6 * 4 + (long)((iVar7 + iVar2 * iVar5) * nTxChan) * 4))
        ;
        iVar4 = k->v2;
      }
      iVar5 = iVar5 + 1;
      iVar8 = iVar8 + -1;
    } while (iVar5 != iVar4);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }